

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_862632::X509Test_Expiry_Test::TestBody(X509Test_Expiry_Test *this)

{
  X509 *pXVar1;
  UniquePtr<X509> UVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  unsigned_long uVar6;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *pcVar7;
  char *in_R9;
  unsigned_long flags;
  initializer_list<x509_st_*> __l;
  initializer_list<x509_st_*> __l_00;
  initializer_list<x509_st_*> __l_01;
  initializer_list<x509_st_*> __l_02;
  initializer_list<x509_st_*> __l_03;
  initializer_list<x509_st_*> __l_04;
  initializer_list<x509_st_*> __l_05;
  initializer_list<x509_st_*> __l_06;
  initializer_list<x509_st_*> __l_07;
  initializer_list<x509_st_*> __l_08;
  initializer_list<x509_st_*> __l_09;
  initializer_list<x509_st_*> __l_10;
  initializer_list<x509_st_*> __l_11;
  initializer_list<x509_st_*> __l_12;
  initializer_list<x509_st_*> __l_13;
  initializer_list<x509_st_*> __l_14;
  initializer_list<x509_st_*> __l_15;
  initializer_list<x509_st_*> __l_16;
  initializer_list<x509_st_*> __l_17;
  initializer_list<x509_st_*> __l_18;
  initializer_list<x509_st_*> __l_19;
  initializer_list<x509_st_*> __l_20;
  initializer_list<x509_st_*> __l_21;
  initializer_list<x509_st_*> __l_22;
  initializer_list<x509_st_*> __l_23;
  initializer_list<x509_st_*> __l_24;
  initializer_list<x509_st_*> __l_25;
  allocator_type local_34d;
  int local_34c;
  AssertionResult gtest_ar;
  int local_338;
  bool partial_chain;
  _Head_base<0UL,_x509_st_*,_false> local_330;
  _Head_base<0UL,_x509_st_*,_false> local_328;
  allocator_type local_31c;
  ScopedTrace gtest_trace_4399;
  ScopedTrace gtest_trace_4397;
  bool check_time;
  _Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_318;
  string local_2f8;
  AssertionResult gtest_ar__4;
  int not_yet_valid;
  int has_expired;
  Certs leaf;
  Certs intermediate;
  undefined2 local_27c;
  undefined2 local_27a;
  Certs root;
  Certs root_cross;
  anon_class_8_1_610b4875 make_certs;
  UniquePtr<EVP_PKEY> key;
  _Any_data local_228;
  undefined8 local_218;
  undefined8 uStack_210;
  _Any_data local_208;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  _Any_data local_1e8;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  _Any_data local_1c8;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  _Any_data local_1a8;
  undefined8 local_198;
  undefined8 uStack_190;
  _Any_data local_188;
  undefined8 local_178;
  undefined8 uStack_170;
  _Any_data local_168;
  undefined8 local_158;
  undefined8 uStack_150;
  _Any_data local_148;
  undefined8 local_138;
  undefined8 uStack_130;
  _Any_data local_128;
  undefined8 local_118;
  undefined8 uStack_110;
  _Any_data local_108;
  undefined8 local_f8;
  undefined8 uStack_f0;
  _Any_data local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  _Any_data local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  _Any_data local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  _Any_data local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  anon_class_8_1_ba1d59bf make_cert;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  PrivateKeyFromPEM((anon_unknown_dwarf_862632 *)&key,
                    "\n-----BEGIN PRIVATE KEY-----\nMIGHAgEAMBMGByqGSM49AgEGCCqGSM49AwEHBG0wawIBAQQgBw8IcnrUoEqc3VnJ\nTYlodwi1b8ldMHcO6NHJzgqLtGqhRANCAATmK2niv2Wfl74vHg2UikzVl2u3qR4N\nRvvdqakendy6WgHn1peoChj5w8SjHlbifINI2xYaHPUdfvGULUvPciLB\n-----END PRIVATE KEY-----\n"
                   );
  root.valid._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_x509_st_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
  root.not_yet_valid._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_x509_st_*,_false>
  ._M_head_impl._0_1_ =
       (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)
       key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0;
  if ((__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)
      key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0) {
    testing::Message::Message((Message *)&root_cross);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2f8,(internal *)&root,(AssertionResult *)0x55f7b2,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&intermediate,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x10fb,local_2f8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&intermediate,(Message *)&root_cross)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&intermediate);
    std::__cxx11::string::~string((string *)&local_2f8);
    if ((long *)CONCAT71(root_cross.not_yet_valid._M_t.
                         super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._1_7_,
                         root_cross.not_yet_valid._M_t.
                         super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._0_1_) != (long *)0x0)
    {
      (**(code **)(*(long *)CONCAT71(root_cross.not_yet_valid._M_t.
                                     super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                     super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._1_7_,
                                     root_cross.not_yet_valid._M_t.
                                     super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                     super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._0_1_) + 8
                  ))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&root.valid);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&root.valid);
    make_certs.make_cert = &make_cert;
    make_cert.key = &key;
    TestBody::anon_class_8_1_610b4875::operator()(&root,&make_certs,"Root","Root",true);
    root_cross.valid._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
    root_cross.not_yet_valid._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._0_1_ =
         (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
         root.valid._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
         (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
    if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
        root.valid._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
      testing::Message::Message((Message *)&intermediate);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_2f8,(internal *)&root_cross,(AssertionResult *)"root.valid","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&leaf,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1124,local_2f8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&leaf,(Message *)&intermediate);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&leaf);
      std::__cxx11::string::~string((string *)&local_2f8);
      if ((long *)CONCAT71(intermediate.not_yet_valid._M_t.
                           super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._1_7_,
                           intermediate.not_yet_valid._M_t.
                           super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._0_1_) !=
          (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(intermediate.not_yet_valid._M_t.
                                       super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                       super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                       super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._1_7_,
                                       intermediate.not_yet_valid._M_t.
                                       super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                       super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                       super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._0_1_) +
                    8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&root_cross.valid);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&root_cross.valid);
      TestBody::anon_class_8_1_610b4875::operator()(&root_cross,&make_certs,"Root 2","Root",true);
      intermediate.valid._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
      intermediate.not_yet_valid._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._0_1_ =
           (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
           root_cross.valid._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
           (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
      if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
          root_cross.valid._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
        testing::Message::Message((Message *)&leaf);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_2f8,(internal *)&intermediate,(AssertionResult *)"root_cross.valid",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__4,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x1126,local_2f8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&leaf);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
        std::__cxx11::string::~string((string *)&local_2f8);
        if ((long *)CONCAT71(leaf.not_yet_valid._M_t.
                             super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._1_7_,
                             leaf.not_yet_valid._M_t.
                             super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._0_1_) !=
            (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(leaf.not_yet_valid._M_t.
                                         super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                         _M_t.
                                         super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                         super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._1_7_,
                                         leaf.not_yet_valid._M_t.
                                         super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                         _M_t.
                                         super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                         super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._0_1_)
                      + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&intermediate.valid);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&intermediate.valid);
        TestBody::anon_class_8_1_610b4875::operator()
                  (&intermediate,&make_certs,"Root","Intermediate",true);
        leaf.valid._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
        leaf.not_yet_valid._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._0_1_ =
             (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
             intermediate.valid._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
             (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
        if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
            intermediate.valid._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
            (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
          testing::Message::Message((Message *)&gtest_ar__4);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_2f8,(internal *)&leaf,(AssertionResult *)"intermediate.valid","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_318,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x1128,local_2f8._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_318,(Message *)&gtest_ar__4);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_318);
          std::__cxx11::string::~string((string *)&local_2f8);
          if (gtest_ar__4._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar__4._0_8_ + 8))();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&leaf.valid);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&leaf.valid);
          TestBody::anon_class_8_1_610b4875::operator()
                    (&leaf,&make_certs,"Intermediate","Leaf",false);
          this_00 = &gtest_ar__4.message_;
          gtest_ar__4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar__4.success_ =
               (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
               leaf.valid._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
               (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
          if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
              leaf.valid._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
              (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
            testing::Message::Message((Message *)&local_318);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_2f8,(internal *)&gtest_ar__4,(AssertionResult *)"leaf.valid","false",
                       "true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x112a,local_2f8._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar,(Message *)&local_318);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
            std::__cxx11::string::~string((string *)&local_2f8);
            if (local_318._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              (*(code *)(*local_318._M_impl.super__Vector_impl_data._M_start)->sig_alg)();
            }
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(this_00);
            local_27a = 1;
            for (lVar5 = 0;
                UVar2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                     leaf.valid._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl, lVar5 != 2;
                lVar5 = lVar5 + 1) {
              check_time = *(bool *)((long)&local_27a + lVar5);
              testing::ScopedTrace::ScopedTrace<bool>
                        (&gtest_trace_4397,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x112d,&check_time);
              local_27c = 1;
              for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
                partial_chain = *(bool *)((long)&local_27c + lVar4);
                testing::ScopedTrace::ScopedTrace<bool>
                          (&gtest_trace_4399,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0x112f,&partial_chain);
                uVar6 = (ulong)(check_time ^ 1) * 0x200000;
                flags = uVar6 + 0x80000;
                if (partial_chain == false) {
                  flags = uVar6;
                }
                not_yet_valid = (uint)check_time + (uint)check_time * 8;
                has_expired = (uint)check_time;
                if (check_time != false) {
                  has_expired = 10;
                }
                pXVar1 = (X509 *)CONCAT71(leaf.not_yet_valid._M_t.
                                          super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_x509_st_*,_false>._M_head_impl.
                                          _1_7_,leaf.not_yet_valid._M_t.
                                                super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                                .super__Head_base<0UL,_x509_st_*,_false>.
                                                _M_head_impl._0_1_);
                local_328._M_head_impl =
                     (x509_st *)
                     root.valid._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                __l._M_len = 1;
                __l._M_array = &local_328._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8,__l,
                           (allocator_type *)&local_338);
                local_330._M_head_impl =
                     (x509_st *)
                     intermediate.valid._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                     ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                __l_00._M_len = 1;
                __l_00._M_array = &local_330._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4,__l_00,
                           &local_34d);
                local_318._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_318._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_318._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_a8._M_unused._M_object = (void *)0x0;
                local_a8._8_8_ = 0;
                local_98 = 0;
                uStack_90 = 0;
                local_34c = Verify(pXVar1,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)
                                          &local_2f8,
                                   (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4,
                                   (vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> *)
                                   &local_318,flags,
                                   (function<void_(x509_store_ctx_st_*)> *)&local_a8);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&gtest_ar,"not_yet_valid",
                           "Verify(leaf.not_yet_valid.get(), {root.valid.get()}, {intermediate.valid.get()}, {}, flags)"
                           ,&not_yet_valid,&local_34c);
                std::_Function_base::~_Function_base((_Function_base *)&local_a8);
                std::_Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~_Vector_base
                          (&local_318);
                std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                          ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4);
                std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                          ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&local_2f8);
                  pcVar7 = "";
                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl !=
                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
                    pcVar7 = *(char **)gtest_ar.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x113e,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar__4,(Message *)&local_2f8);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
                  if ((long *)local_2f8._M_dataplus._M_p != (long *)0x0) {
                    (**(code **)(*(long *)local_2f8._M_dataplus._M_p + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar.message_);
                UVar2 = leaf.valid;
                local_328._M_head_impl =
                     (x509_st *)
                     root.valid._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                __l_01._M_len = 1;
                __l_01._M_array = &local_328._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8,__l_01,
                           (allocator_type *)&local_338);
                local_330._M_head_impl =
                     (x509_st *)
                     CONCAT71(intermediate.not_yet_valid._M_t.
                              super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._1_7_,
                              intermediate.not_yet_valid._M_t.
                              super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._0_1_);
                __l_02._M_len = 1;
                __l_02._M_array = &local_330._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4,__l_02,
                           &local_34d);
                local_318._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_318._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_318._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_c8._M_unused._M_object = (void *)0x0;
                local_c8._8_8_ = 0;
                local_b8 = 0;
                uStack_b0 = 0;
                local_34c = Verify((X509 *)UVar2._M_t.
                                           super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                           _M_t.
                                           super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                                   (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8,
                                   (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4,
                                   (vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> *)
                                   &local_318,flags,
                                   (function<void_(x509_store_ctx_st_*)> *)&local_c8);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&gtest_ar,"not_yet_valid",
                           "Verify(leaf.valid.get(), {root.valid.get()}, {intermediate.not_yet_valid.get()}, {}, flags)"
                           ,&not_yet_valid,&local_34c);
                std::_Function_base::~_Function_base((_Function_base *)&local_c8);
                std::_Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~_Vector_base
                          (&local_318);
                std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                          ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4);
                std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                          ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&local_2f8);
                  pcVar7 = "";
                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl !=
                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
                    pcVar7 = *(char **)gtest_ar.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x1141,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar__4,(Message *)&local_2f8);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
                  if ((long *)local_2f8._M_dataplus._M_p != (long *)0x0) {
                    (**(code **)(*(long *)local_2f8._M_dataplus._M_p + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar.message_);
                UVar2 = leaf.valid;
                local_328._M_head_impl =
                     (x509_st *)
                     CONCAT71(root.not_yet_valid._M_t.
                              super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._1_7_,
                              root.not_yet_valid._M_t.
                              super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._0_1_);
                __l_03._M_len = 1;
                __l_03._M_array = &local_328._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8,__l_03,
                           (allocator_type *)&local_338);
                local_330._M_head_impl =
                     (x509_st *)
                     intermediate.valid._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                     ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                __l_04._M_len = 1;
                __l_04._M_array = &local_330._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4,__l_04,
                           &local_34d);
                local_318._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_318._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_318._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_e8._M_unused._M_object = (void *)0x0;
                local_e8._8_8_ = 0;
                local_d8 = 0;
                uStack_d0 = 0;
                local_34c = Verify((X509 *)UVar2._M_t.
                                           super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                           _M_t.
                                           super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                                   (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8,
                                   (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4,
                                   (vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> *)
                                   &local_318,flags,
                                   (function<void_(x509_store_ctx_st_*)> *)&local_e8);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&gtest_ar,"not_yet_valid",
                           "Verify(leaf.valid.get(), {root.not_yet_valid.get()}, {intermediate.valid.get()}, {}, flags)"
                           ,&not_yet_valid,&local_34c);
                std::_Function_base::~_Function_base((_Function_base *)&local_e8);
                std::_Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~_Vector_base
                          (&local_318);
                std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                          ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4);
                std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                          ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&local_2f8);
                  pcVar7 = "";
                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl !=
                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
                    pcVar7 = *(char **)gtest_ar.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x1144,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar__4,(Message *)&local_2f8);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
                  if ((long *)local_2f8._M_dataplus._M_p != (long *)0x0) {
                    (**(code **)(*(long *)local_2f8._M_dataplus._M_p + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar.message_);
                UVar2 = leaf.valid;
                local_34c = 0;
                local_328._M_head_impl =
                     (x509_st *)
                     root.valid._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                __l_05._M_len = 1;
                __l_05._M_array = &local_328._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8,__l_05,
                           &local_34d);
                local_330._M_head_impl =
                     (x509_st *)
                     intermediate.valid._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                     ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                __l_06._M_len = 1;
                __l_06._M_array = &local_330._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4,__l_06,
                           &local_31c);
                local_318._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_318._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_318._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_108._M_unused._M_object = (void *)0x0;
                local_108._8_8_ = 0;
                local_f8 = 0;
                uStack_f0 = 0;
                local_338 = Verify((X509 *)UVar2._M_t.
                                           super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                           _M_t.
                                           super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                                   (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8,
                                   (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4,
                                   (vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> *)
                                   &local_318,flags,
                                   (function<void_(x509_store_ctx_st_*)> *)&local_108);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&gtest_ar,"0",
                           "Verify(leaf.valid.get(), {root.valid.get()}, {intermediate.valid.get()}, {}, flags)"
                           ,&local_34c,&local_338);
                std::_Function_base::~_Function_base((_Function_base *)&local_108);
                std::_Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~_Vector_base
                          (&local_318);
                std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                          ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4);
                std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                          ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&local_2f8);
                  pcVar7 = "";
                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl !=
                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
                    pcVar7 = *(char **)gtest_ar.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x1147,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar__4,(Message *)&local_2f8);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
                  if ((long *)local_2f8._M_dataplus._M_p != (long *)0x0) {
                    (**(code **)(*(long *)local_2f8._M_dataplus._M_p + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar.message_);
                UVar2 = leaf.expired;
                local_328._M_head_impl =
                     (x509_st *)
                     root.valid._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                __l_07._M_len = 1;
                __l_07._M_array = &local_328._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8,__l_07,
                           (allocator_type *)&local_338);
                local_330._M_head_impl =
                     (x509_st *)
                     intermediate.valid._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                     ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                __l_08._M_len = 1;
                __l_08._M_array = &local_330._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4,__l_08,
                           &local_34d);
                local_318._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_318._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_318._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_128._M_unused._M_object = (void *)0x0;
                local_128._8_8_ = 0;
                local_118 = 0;
                uStack_110 = 0;
                local_34c = Verify((X509 *)UVar2._M_t.
                                           super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                           _M_t.
                                           super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                                   (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8,
                                   (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4,
                                   (vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> *)
                                   &local_318,flags,
                                   (function<void_(x509_store_ctx_st_*)> *)&local_128);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&gtest_ar,"has_expired",
                           "Verify(leaf.expired.get(), {root.valid.get()}, {intermediate.valid.get()}, {}, flags)"
                           ,&has_expired,&local_34c);
                std::_Function_base::~_Function_base((_Function_base *)&local_128);
                std::_Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~_Vector_base
                          (&local_318);
                std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                          ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4);
                std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                          ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&local_2f8);
                  pcVar7 = "";
                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl !=
                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
                    pcVar7 = *(char **)gtest_ar.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x114a,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar__4,(Message *)&local_2f8);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
                  if ((long *)local_2f8._M_dataplus._M_p != (long *)0x0) {
                    (**(code **)(*(long *)local_2f8._M_dataplus._M_p + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar.message_);
                UVar2 = leaf.valid;
                local_328._M_head_impl =
                     (x509_st *)
                     root.valid._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                __l_09._M_len = 1;
                __l_09._M_array = &local_328._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8,__l_09,
                           (allocator_type *)&local_338);
                local_330._M_head_impl =
                     (x509_st *)
                     intermediate.expired._M_t.
                     super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                __l_10._M_len = 1;
                __l_10._M_array = &local_330._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4,__l_10,
                           &local_34d);
                local_318._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_318._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_318._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_148._M_unused._M_object = (void *)0x0;
                local_148._8_8_ = 0;
                local_138 = 0;
                uStack_130 = 0;
                local_34c = Verify((X509 *)UVar2._M_t.
                                           super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                           _M_t.
                                           super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                                   (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8,
                                   (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4,
                                   (vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> *)
                                   &local_318,flags,
                                   (function<void_(x509_store_ctx_st_*)> *)&local_148);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&gtest_ar,"has_expired",
                           "Verify(leaf.valid.get(), {root.valid.get()}, {intermediate.expired.get()}, {}, flags)"
                           ,&has_expired,&local_34c);
                std::_Function_base::~_Function_base((_Function_base *)&local_148);
                std::_Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~_Vector_base
                          (&local_318);
                std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                          ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4);
                std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                          ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&local_2f8);
                  pcVar7 = "";
                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl !=
                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
                    pcVar7 = *(char **)gtest_ar.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x114c,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar__4,(Message *)&local_2f8);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
                  if ((long *)local_2f8._M_dataplus._M_p != (long *)0x0) {
                    (**(code **)(*(long *)local_2f8._M_dataplus._M_p + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar.message_);
                UVar2 = leaf.valid;
                local_328._M_head_impl =
                     (x509_st *)
                     root.expired._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                __l_11._M_len = 1;
                __l_11._M_array = &local_328._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8,__l_11,
                           (allocator_type *)&local_338);
                local_330._M_head_impl =
                     (x509_st *)
                     intermediate.valid._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                     ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                __l_12._M_len = 1;
                __l_12._M_array = &local_330._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4,__l_12,
                           &local_34d);
                local_318._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_318._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_318._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_168._M_unused._M_object = (void *)0x0;
                local_168._8_8_ = 0;
                local_158 = 0;
                uStack_150 = 0;
                local_34c = Verify((X509 *)UVar2._M_t.
                                           super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                           _M_t.
                                           super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                                   (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8,
                                   (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4,
                                   (vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> *)
                                   &local_318,flags,
                                   (function<void_(x509_store_ctx_st_*)> *)&local_168);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&gtest_ar,"has_expired",
                           "Verify(leaf.valid.get(), {root.expired.get()}, {intermediate.valid.get()}, {}, flags)"
                           ,&has_expired,&local_34c);
                std::_Function_base::~_Function_base((_Function_base *)&local_168);
                std::_Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~_Vector_base
                          (&local_318);
                std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                          ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4);
                std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                          ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&local_2f8);
                  pcVar7 = "";
                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl !=
                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
                    pcVar7 = *(char **)gtest_ar.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x114e,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar__4,(Message *)&local_2f8);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
                  if ((long *)local_2f8._M_dataplus._M_p != (long *)0x0) {
                    (**(code **)(*(long *)local_2f8._M_dataplus._M_p + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar.message_);
                UVar2 = leaf.valid;
                if (partial_chain == false) {
                  local_34c = 2;
                  local_328._M_head_impl =
                       (x509_st *)
                       root_cross.valid._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                       ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                  __l_19._M_len = 1;
                  __l_19._M_array = &local_328._M_head_impl;
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                            ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8,__l_19,
                             &local_34d);
                  local_330._M_head_impl =
                       (x509_st *)
                       intermediate.valid._M_t.
                       super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                  __l_20._M_len = 1;
                  __l_20._M_array = &local_330._M_head_impl;
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                            ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4,__l_20,
                             &local_31c);
                  local_318._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_318._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_318._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_188._M_unused._M_object = (void *)0x0;
                  local_188._8_8_ = 0;
                  local_178 = 0;
                  uStack_170 = 0;
                  local_338 = Verify((X509 *)UVar2._M_t.
                                             super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                             .super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                                     (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8,
                                     (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4,
                                     (vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> *)
                                     &local_318,flags,
                                     (function<void_(x509_store_ctx_st_*)> *)&local_188);
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)&gtest_ar,"2",
                             "Verify(leaf.valid.get(), {root_cross.valid.get()}, {intermediate.valid.get()}, {}, flags)"
                             ,&local_34c,&local_338);
                  std::_Function_base::~_Function_base((_Function_base *)&local_188);
                  std::_Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~_Vector_base
                            (&local_318);
                  std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                            ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4);
                  std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                            ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&local_2f8);
                    pcVar7 = "";
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl !=
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pcVar7 = *(char **)gtest_ar.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                               ,0x1154,pcVar7);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar__4,(Message *)&local_2f8);
                    goto LAB_00368112;
                  }
                }
                else {
                  local_34c = 0;
                  local_328._M_head_impl =
                       (x509_st *)
                       root_cross.valid._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                       ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                  __l_13._M_len = 1;
                  __l_13._M_array = &local_328._M_head_impl;
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                            ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8,__l_13,
                             &local_34d);
                  local_330._M_head_impl =
                       (x509_st *)
                       intermediate.valid._M_t.
                       super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                  __l_14._M_len = 1;
                  __l_14._M_array = &local_330._M_head_impl;
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                            ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4,__l_14,
                             &local_31c);
                  local_318._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_318._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_318._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_1a8._M_unused._M_object = (void *)0x0;
                  local_1a8._8_8_ = 0;
                  local_198 = 0;
                  uStack_190 = 0;
                  local_338 = Verify((X509 *)UVar2._M_t.
                                             super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                             .super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                                     (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8,
                                     (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4,
                                     (vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> *)
                                     &local_318,flags,
                                     (function<void_(x509_store_ctx_st_*)> *)&local_1a8);
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)&gtest_ar,"0",
                             "Verify(leaf.valid.get(), {root_cross.valid.get()}, {intermediate.valid.get()}, {}, flags)"
                             ,&local_34c,&local_338);
                  std::_Function_base::~_Function_base((_Function_base *)&local_1a8);
                  std::_Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~_Vector_base
                            (&local_318);
                  std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                            ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4);
                  std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                            ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&local_2f8);
                    pcVar7 = "";
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl !=
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pcVar7 = *(char **)gtest_ar.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                               ,0x1158,pcVar7);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar__4,(Message *)&local_2f8);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
                    if ((long *)local_2f8._M_dataplus._M_p != (long *)0x0) {
                      (**(code **)(*(long *)local_2f8._M_dataplus._M_p + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar.message_);
                  UVar2 = leaf.valid;
                  local_328._M_head_impl =
                       (x509_st *)
                       CONCAT71(root_cross.not_yet_valid._M_t.
                                super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._1_7_,
                                root_cross.not_yet_valid._M_t.
                                super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._0_1_);
                  __l_15._M_len = 1;
                  __l_15._M_array = &local_328._M_head_impl;
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                            ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8,__l_15,
                             (allocator_type *)&local_338);
                  local_330._M_head_impl =
                       (x509_st *)
                       intermediate.valid._M_t.
                       super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                  __l_16._M_len = 1;
                  __l_16._M_array = &local_330._M_head_impl;
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                            ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4,__l_16,
                             &local_34d);
                  local_318._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_318._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_318._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_1c8._M_unused._M_object = (void *)0x0;
                  local_1c8._8_8_ = 0;
                  local_1b8 = 0;
                  uStack_1b0 = 0;
                  local_34c = Verify((X509 *)UVar2._M_t.
                                             super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                             .super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                                     (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8,
                                     (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4,
                                     (vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> *)
                                     &local_318,flags,
                                     (function<void_(x509_store_ctx_st_*)> *)&local_1c8);
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)&gtest_ar,"not_yet_valid",
                             "Verify(leaf.valid.get(), {root_cross.not_yet_valid.get()}, {intermediate.valid.get()}, {}, flags)"
                             ,&not_yet_valid,&local_34c);
                  std::_Function_base::~_Function_base((_Function_base *)&local_1c8);
                  std::_Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~_Vector_base
                            (&local_318);
                  std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                            ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4);
                  std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                            ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&local_2f8);
                    pcVar7 = "";
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl !=
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pcVar7 = *(char **)gtest_ar.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                               ,0x115c,pcVar7);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar__4,(Message *)&local_2f8);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
                    if ((long *)local_2f8._M_dataplus._M_p != (long *)0x0) {
                      (**(code **)(*(long *)local_2f8._M_dataplus._M_p + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar.message_);
                  UVar2 = leaf.valid;
                  local_328._M_head_impl =
                       (x509_st *)
                       root_cross.expired._M_t.
                       super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                  __l_17._M_len = 1;
                  __l_17._M_array = &local_328._M_head_impl;
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                            ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8,__l_17,
                             (allocator_type *)&local_338);
                  local_330._M_head_impl =
                       (x509_st *)
                       intermediate.valid._M_t.
                       super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                  __l_18._M_len = 1;
                  __l_18._M_array = &local_330._M_head_impl;
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                            ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4,__l_18,
                             &local_34d);
                  local_318._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_318._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_318._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_1e8._M_unused._M_object = (void *)0x0;
                  local_1e8._8_8_ = 0;
                  local_1d8 = 0;
                  uStack_1d0 = 0;
                  local_34c = Verify((X509 *)UVar2._M_t.
                                             super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                             .super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                                     (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8,
                                     (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4,
                                     (vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> *)
                                     &local_318,flags,
                                     (function<void_(x509_store_ctx_st_*)> *)&local_1e8);
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)&gtest_ar,"has_expired",
                             "Verify(leaf.valid.get(), {root_cross.expired.get()}, {intermediate.valid.get()}, {}, flags)"
                             ,&has_expired,&local_34c);
                  std::_Function_base::~_Function_base((_Function_base *)&local_1e8);
                  std::_Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~_Vector_base
                            (&local_318);
                  std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                            ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4);
                  std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                            ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&local_2f8);
                    pcVar7 = "";
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl !=
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pcVar7 = *(char **)gtest_ar.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                               ,0x115f,pcVar7);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar__4,(Message *)&local_2f8);
LAB_00368112:
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
                    if ((long *)local_2f8._M_dataplus._M_p != (long *)0x0) {
                      (**(code **)(*(long *)local_2f8._M_dataplus._M_p + 8))();
                    }
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar.message_);
                UVar2 = root.valid;
                local_330._M_head_impl = local_330._M_head_impl & 0xffffffff00000000;
                local_328._M_head_impl =
                     (x509_st *)
                     root.valid._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                __l_21._M_len = 1;
                __l_21._M_array = &local_328._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8,__l_21,
                           (allocator_type *)&local_338);
                local_318._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                gtest_ar__4.success_ = false;
                gtest_ar__4._1_7_ = 0;
                gtest_ar__4.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                local_318._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_318._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_208._M_unused._M_object = (void *)0x0;
                local_208._8_8_ = 0;
                local_1f8 = 0;
                uStack_1f0 = 0;
                local_34c = Verify((X509 *)UVar2._M_t.
                                           super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                           _M_t.
                                           super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                                   (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8,
                                   (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4,
                                   (vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> *)
                                   &local_318,flags,
                                   (function<void_(x509_store_ctx_st_*)> *)&local_208);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&gtest_ar,"0",
                           "Verify(root.valid.get(), {root.valid.get()}, {}, {}, flags)",
                           (int *)&local_330,&local_34c);
                std::_Function_base::~_Function_base((_Function_base *)&local_208);
                std::_Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~_Vector_base
                          (&local_318);
                std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                          ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4);
                std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                          ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&local_2f8);
                  pcVar7 = "";
                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl !=
                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
                    pcVar7 = *(char **)gtest_ar.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x1165,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar__4,(Message *)&local_2f8);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
                  if ((long *)local_2f8._M_dataplus._M_p != (long *)0x0) {
                    (**(code **)(*(long *)local_2f8._M_dataplus._M_p + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar.message_);
                pXVar1 = (X509 *)CONCAT71(root.not_yet_valid._M_t.
                                          super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_x509_st_*,_false>._M_head_impl.
                                          _1_7_,root.not_yet_valid._M_t.
                                                super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                                .super__Head_base<0UL,_x509_st_*,_false>.
                                                _M_head_impl._0_1_);
                __l_22._M_len = 1;
                __l_22._M_array = &local_328._M_head_impl;
                local_328._M_head_impl = pXVar1;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8,__l_22,
                           (allocator_type *)&local_34c);
                local_318._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                gtest_ar__4.success_ = false;
                gtest_ar__4._1_7_ = 0;
                gtest_ar__4.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                local_318._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_318._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_228._M_unused._M_object = (void *)0x0;
                local_228._8_8_ = 0;
                local_218 = 0;
                uStack_210 = 0;
                iVar3 = Verify(pXVar1,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8,
                               (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4,
                               (vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> *)&local_318,
                               flags,(function<void_(x509_store_ctx_st_*)> *)&local_228);
                local_330._M_head_impl._0_4_ = iVar3;
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&gtest_ar,"not_yet_valid",
                           "Verify(root.not_yet_valid.get(), {root.not_yet_valid.get()}, {}, {}, flags)"
                           ,&not_yet_valid,(int *)&local_330);
                std::_Function_base::~_Function_base((_Function_base *)&local_228);
                std::_Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~_Vector_base
                          (&local_318);
                std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                          ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4);
                std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                          ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&local_2f8);
                  pcVar7 = "";
                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl !=
                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
                    pcVar7 = *(char **)gtest_ar.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x1168,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar__4,(Message *)&local_2f8);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
                  if ((long *)local_2f8._M_dataplus._M_p != (long *)0x0) {
                    (**(code **)(*(long *)local_2f8._M_dataplus._M_p + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar.message_);
                UVar2 = root.expired;
                local_328._M_head_impl =
                     (x509_st *)
                     root.expired._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                __l_23._M_len = 1;
                __l_23._M_array = &local_328._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8,__l_23,
                           (allocator_type *)&local_34c);
                local_318._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                gtest_ar__4.success_ = false;
                gtest_ar__4._1_7_ = 0;
                gtest_ar__4.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                local_318._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_318._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_88._M_unused._M_object = (void *)0x0;
                local_88._8_8_ = 0;
                local_78 = 0;
                uStack_70 = 0;
                iVar3 = Verify((X509 *)UVar2._M_t.
                                       super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                       super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                       super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                               (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8,
                               (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4,
                               (vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> *)&local_318,
                               flags,(function<void_(x509_store_ctx_st_*)> *)&local_88);
                local_330._M_head_impl._0_4_ = iVar3;
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&gtest_ar,"has_expired",
                           "Verify(root.expired.get(), {root.expired.get()}, {}, {}, flags)",
                           &has_expired,(int *)&local_330);
                std::_Function_base::~_Function_base((_Function_base *)&local_88);
                std::_Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~_Vector_base
                          (&local_318);
                std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                          ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4);
                std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                          ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&local_2f8);
                  pcVar7 = "";
                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl !=
                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
                    pcVar7 = *(char **)gtest_ar.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x116a,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar__4,(Message *)&local_2f8);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
                  if ((long *)local_2f8._M_dataplus._M_p != (long *)0x0) {
                    (**(code **)(*(long *)local_2f8._M_dataplus._M_p + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar.message_);
                testing::ScopedTrace::~ScopedTrace(&gtest_trace_4399);
              }
              testing::ScopedTrace::~ScopedTrace(&gtest_trace_4397);
            }
            not_yet_valid = 10;
            local_328._M_head_impl =
                 (x509_st *)
                 root.valid._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
            __l_24._M_len = 1;
            __l_24._M_array = &local_328._M_head_impl;
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                      ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8,__l_24,
                       (allocator_type *)&local_34c);
            local_330._M_head_impl =
                 (x509_st *)
                 intermediate.valid._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                 _M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
            __l_25._M_len = 1;
            __l_25._M_array = &local_330._M_head_impl;
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                      ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4,__l_25,
                       (allocator_type *)&local_338);
            local_318._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_318._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_318._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_58._M_unused._M_object = (void *)0x0;
            local_58._8_8_ = 0;
            local_40 = std::
                       _Function_handler<void_(x509_store_ctx_st_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc:4465:3)>
                       ::_M_invoke;
            local_48 = std::
                       _Function_handler<void_(x509_store_ctx_st_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc:4465:3)>
                       ::_M_manager;
            has_expired = Verify((X509 *)UVar2._M_t.
                                         super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                         _M_t.
                                         super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                         super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                                 (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8,
                                 (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4,
                                 (vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> *)&local_318
                                 ,0,(function<void_(x509_store_ctx_st_*)> *)&local_58);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&gtest_ar,"10",
                       "Verify(leaf.valid.get(), {root.valid.get()}, {intermediate.valid.get()}, {}, 0, [](X509_STORE_CTX *ctx) { X509_VERIFY_PARAM *param = X509_STORE_CTX_get0_param(ctx); X509_VERIFY_PARAM_clear_flags(param, 0x2); })"
                       ,&not_yet_valid,&has_expired);
            std::_Function_base::~_Function_base((_Function_base *)&local_58);
            std::_Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~_Vector_base
                      (&local_318);
            std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                      ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar__4);
            std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                      ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_2f8);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&local_2f8);
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl ==
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pcVar7 = "";
              }
              else {
                pcVar7 = *(char **)gtest_ar.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x1177,pcVar7);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__4,(Message *)&local_2f8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
              if ((long *)local_2f8._M_dataplus._M_p != (long *)0x0) {
                (**(code **)(*(long *)local_2f8._M_dataplus._M_p + 8))();
              }
            }
            this_00 = &gtest_ar.message_;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(this_00);
          TestBody::Certs::~Certs(&leaf);
        }
        TestBody::Certs::~Certs(&intermediate);
      }
      TestBody::Certs::~Certs(&root_cross);
    }
    TestBody::Certs::~Certs(&root);
  }
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&key);
  return;
}

Assistant:

TEST(X509Test, Expiry) {
  bssl::UniquePtr<EVP_PKEY> key = PrivateKeyFromPEM(kP256Key);
  ASSERT_TRUE(key);

  auto make_cert = [&](const char *issuer, const char *subject, bool is_ca,
                       int not_before_offset,
                       int not_after_offset) -> bssl::UniquePtr<X509> {
    bssl::UniquePtr<X509> cert =
        MakeTestCert(issuer, subject, key.get(), is_ca);
    if (cert == nullptr ||
        !ASN1_TIME_adj(X509_getm_notBefore(cert.get()), kReferenceTime,
                       /*offset_day=*/not_before_offset,
                       /*offset_sec=*/0) ||
        !ASN1_TIME_adj(X509_getm_notAfter(cert.get()), kReferenceTime,
                       /*offset_day=*/not_after_offset,
                       /*offset_sec=*/0) ||
        !X509_sign(cert.get(), key.get(), EVP_sha256())) {
      return nullptr;
    }
    return cert;
  };

  struct Certs {
    bssl::UniquePtr<X509> not_yet_valid, valid, expired;
  };
  auto make_certs = [&](const char *issuer, const char *subject,
                        bool is_ca) -> Certs {
    Certs certs;
    certs.not_yet_valid =
        make_cert(issuer, subject, is_ca, /*not_before_offset=*/1,
                  /*not_after_offset=*/2);
    certs.valid = make_cert(issuer, subject, is_ca, /*not_before_offset=*/-1,
                            /*not_after_offset=*/1);
    certs.expired = make_cert(issuer, subject, is_ca, /*not_before_offset=*/-2,
                              /*not_after_offset=*/-1);
    if (certs.not_yet_valid == nullptr || certs.valid == nullptr ||
        certs.expired == nullptr) {
      return Certs{};
    }
    return certs;
  };

  Certs root = make_certs("Root", "Root", /*is_ca=*/true);
  ASSERT_TRUE(root.valid);
  Certs root_cross = make_certs("Root 2", "Root", /*is_ca=*/true);
  ASSERT_TRUE(root_cross.valid);
  Certs intermediate = make_certs("Root", "Intermediate", /*is_ca=*/true);
  ASSERT_TRUE(intermediate.valid);
  Certs leaf = make_certs("Intermediate", "Leaf", /*is_ca=*/false);
  ASSERT_TRUE(leaf.valid);

  for (bool check_time : {true, false}) {
    SCOPED_TRACE(check_time);
    for (bool partial_chain : {true, false}) {
      SCOPED_TRACE(partial_chain);
      unsigned long flags = 0;
      if (!check_time) {
        flags |= X509_V_FLAG_NO_CHECK_TIME;
      }
      if (partial_chain) {
        flags |= X509_V_FLAG_PARTIAL_CHAIN;
      }

      int not_yet_valid =
          check_time ? X509_V_ERR_CERT_NOT_YET_VALID : X509_V_OK;
      int has_expired = check_time ? X509_V_ERR_CERT_HAS_EXPIRED : X509_V_OK;

      EXPECT_EQ(not_yet_valid,
                Verify(leaf.not_yet_valid.get(), {root.valid.get()},
                       {intermediate.valid.get()}, {}, flags));
      EXPECT_EQ(not_yet_valid,
                Verify(leaf.valid.get(), {root.valid.get()},
                       {intermediate.not_yet_valid.get()}, {}, flags));
      EXPECT_EQ(not_yet_valid,
                Verify(leaf.valid.get(), {root.not_yet_valid.get()},
                       {intermediate.valid.get()}, {}, flags));

      EXPECT_EQ(X509_V_OK, Verify(leaf.valid.get(), {root.valid.get()},
                                  {intermediate.valid.get()}, {}, flags));

      EXPECT_EQ(has_expired, Verify(leaf.expired.get(), {root.valid.get()},
                                    {intermediate.valid.get()}, {}, flags));
      EXPECT_EQ(has_expired, Verify(leaf.valid.get(), {root.valid.get()},
                                    {intermediate.expired.get()}, {}, flags));
      EXPECT_EQ(has_expired, Verify(leaf.valid.get(), {root.expired.get()},
                                    {intermediate.valid.get()}, {}, flags));

      if (!partial_chain) {
        // By default, non-self-signed certificates are not valid trust anchors.
        EXPECT_EQ(X509_V_ERR_UNABLE_TO_GET_ISSUER_CERT,
                  Verify(leaf.valid.get(), {root_cross.valid.get()},
                         {intermediate.valid.get()}, {}, flags));
      } else {
        // |X509_V_FLAG_PARTIAL_CHAIN| allows non-self-signed trust anchors.
        EXPECT_EQ(X509_V_OK, Verify(leaf.valid.get(), {root_cross.valid.get()},
                                    {intermediate.valid.get()}, {}, flags));
        // Expiry of the trust anchor must still be checked.
        EXPECT_EQ(not_yet_valid,
                  Verify(leaf.valid.get(), {root_cross.not_yet_valid.get()},
                         {intermediate.valid.get()}, {}, flags));
        EXPECT_EQ(has_expired,
                  Verify(leaf.valid.get(), {root_cross.expired.get()},
                         {intermediate.valid.get()}, {}, flags));
      }

      // When the trust anchor is the target certificate, expiry should also be
      // checked.
      EXPECT_EQ(X509_V_OK,
                Verify(root.valid.get(), {root.valid.get()}, {}, {}, flags));
      EXPECT_EQ(not_yet_valid,
                Verify(root.not_yet_valid.get(), {root.not_yet_valid.get()}, {},
                       {}, flags));
      EXPECT_EQ(has_expired, Verify(root.expired.get(), {root.expired.get()},
                                    {}, {}, flags));
    }
  }

  // X509_V_FLAG_USE_CHECK_TIME is an internal flag, but one caller relies on
  // being able to clear it to restore the system time. Using the system time,
  // all certificates in this test should read as expired.
  EXPECT_EQ(X509_V_ERR_CERT_HAS_EXPIRED,
            Verify(leaf.valid.get(), {root.valid.get()},
                   {intermediate.valid.get()}, {}, 0, [](X509_STORE_CTX *ctx) {
                     X509_VERIFY_PARAM *param = X509_STORE_CTX_get0_param(ctx);
                     X509_VERIFY_PARAM_clear_flags(param,
                                                   X509_V_FLAG_USE_CHECK_TIME);
                   }));
}